

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O0

void xm_update_frequency(xm_context_t *ctx,xm_channel_context_t *ch)

{
  long in_RSI;
  long in_RDI;
  float fVar1;
  float unaff_retaddr;
  float unaff_retaddr_00;
  
  fVar1 = xm_frequency((xm_context_t *)ch,unaff_retaddr_00,unaff_retaddr,
                       (float)((ulong)in_RDI >> 0x20));
  *(float *)(in_RSI + 0x28) = fVar1;
  *(float *)(in_RSI + 0x2c) = *(float *)(in_RSI + 0x28) / (float)*(uint *)(in_RDI + 0x128);
  return;
}

Assistant:

static void xm_update_frequency(xm_context_t* ctx, xm_channel_context_t* ch) {
	ch->frequency = xm_frequency(
		ctx, ch->period,
		ch->arp_note_offset,
		ch->vibrato_note_offset + ch->autovibrato_note_offset
	);
	ch->step = ch->frequency / ctx->rate;
}